

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_sem_trywait(uv_sem_t *sem)

{
  uv_sem_t *sem_local;
  
  if (platform_needs_custom_semaphore == 0) {
    sem_local._4_4_ = uv__sem_trywait(sem);
  }
  else {
    sem_local._4_4_ = uv__custom_sem_trywait(sem);
  }
  return sem_local._4_4_;
}

Assistant:

int uv_sem_trywait(uv_sem_t* sem) {
  if (platform_needs_custom_semaphore)
    return uv__custom_sem_trywait(sem);
  else
    return uv__sem_trywait(sem);
}